

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O2

void __thiscall xray_re::xr_bone::calculate_bind(xr_bone *this,fmatrix *parent_xform)

{
  fmatrix *this_00;
  pointer ppxVar1;
  pointer ppxVar2;
  
  this_00 = &this->m_bind_xform;
  _matrix<float>::set_xyz_i(this_00,&this->m_bind_rotate);
  *(undefined8 *)((long)&(this->m_bind_xform).field_0 + 0x30) =
       *(undefined8 *)&(this->m_bind_offset).field_0;
  (this->m_bind_xform).field_0.field_0._43 = (this->m_bind_offset).field_0.field_0.z;
  _matrix<float>::mul_a_43(this_00,parent_xform);
  _matrix<float>::invert_43(&this->m_bind_i_xform,this_00);
  ppxVar1 = (this->m_children).
            super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppxVar2 = (this->m_children).
                 super__Vector_base<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppxVar2 != ppxVar1; ppxVar2 = ppxVar2 + 1) {
    calculate_bind(*ppxVar2,this_00);
  }
  return;
}

Assistant:

void xr_bone::calculate_bind(const fmatrix& parent_xform)
{
	m_bind_xform.set_xyz_i(m_bind_rotate);
	m_bind_xform.c.set(m_bind_offset);
	m_bind_xform.mul_a_43(parent_xform);
	m_bind_i_xform.invert_43(m_bind_xform);

	for (xr_bone_vec_it it = m_children.begin(), end = m_children.end(); it != end; ++it)
		(*it)->calculate_bind(m_bind_xform);
}